

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v10::detail::write_escaped_char<char,fmt::v10::appender>(appender out,char v)

{
  bool bVar1;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> this;
  char in_SIL;
  buffer<char> *in_RDI;
  find_escape_result<char> *in_stack_00000040;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_00000048;
  char v_array [1];
  value_type_conflict1 *in_stack_ffffffffffffff98;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> in_stack_ffffffffffffffa0;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_50;
  undefined1 *local_48;
  char *local_40;
  int local_38;
  buffer<char> *local_30;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_28;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_20;
  undefined1 local_13;
  undefined1 local_12;
  char local_11;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_10 [2];
  
  local_13 = 0x27;
  local_11 = in_SIL;
  local_10[0].container = in_RDI;
  local_20.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
  std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_20);
  std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
            ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)
             in_stack_ffffffffffffffa0.container,in_stack_ffffffffffffff98);
  bVar1 = needs_escape(0);
  if (((bVar1) && (local_11 != '\"')) || (local_11 == '\'')) {
    local_30 = local_10[0].container;
    local_48 = &local_12;
    local_40 = &local_11;
    local_38 = (int)local_11;
    local_28.container =
         (buffer<char> *)
         write_escaped_cp<fmt::v10::appender,char>(in_stack_00000048.container,in_stack_00000040);
    local_10[0].container = local_28.container;
  }
  else {
    local_50.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
    std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*(&local_50);
    std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
              ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)
               in_stack_ffffffffffffffa0.container,in_stack_ffffffffffffff98);
  }
  this.container = (buffer<char> *)appender::operator++((appender *)local_10,0);
  std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator*
            ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)&stack0xffffffffffffffa0);
  std::back_insert_iterator<fmt::v10::detail::buffer<char>_>::operator=
            ((back_insert_iterator<fmt::v10::detail::buffer<char>_> *)this.container,
             in_stack_ffffffffffffff98);
  return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_10[0].container;
}

Assistant:

auto write_escaped_char(OutputIt out, Char v) -> OutputIt {
  Char v_array[1] = {v};
  *out++ = static_cast<Char>('\'');
  if ((needs_escape(static_cast<uint32_t>(v)) && v != static_cast<Char>('"')) ||
      v == static_cast<Char>('\'')) {
    out = write_escaped_cp(out,
                           find_escape_result<Char>{v_array, v_array + 1,
                                                    static_cast<uint32_t>(v)});
  } else {
    *out++ = v;
  }
  *out++ = static_cast<Char>('\'');
  return out;
}